

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O2

Index __thiscall
IndividualBeliefJESP::GetAugmentedStateIndex
          (IndividualBeliefJESP *this,Index sI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oHist_others)

{
  uint uVar1;
  Index IVar2;
  LIndex i;
  uint uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> withinStageOHIndices_o;
  Index local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  Index local_24;
  
  local_5c = sI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
             (long)(oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_58);
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar3 = uVar3 + 1) {
    uVar1 = (oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (this->_m_pumadp,
                   (this->_m_others).super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4],this->_m_stage);
    IVar2 = Globals::CastLIndexToIndex(i);
    local_40._M_impl.super__Vector_impl_data._M_start[uVar4] = uVar1 - IVar2;
  }
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c);
  local_24 = IndexTools::IndividualToJointIndicesStepSize
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
                        this->_m_stepsizeJOHOH);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_24);
  IVar2 = IndexTools::IndividualToJointIndicesStepSize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
                     this->_m_stepsizeSJOH);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return IVar2;
}

Assistant:

Index 
IndividualBeliefJESP::GetAugmentedStateIndex(Index sI, 
        const vector<Index>& oHist_others) const
{
    //get indices without the offset for the stage:
    vector<Index> withinStageOHIndices_o = vector<Index>(oHist_others.size());
    for(Index j=0; j < withinStageOHIndices_o.size(); j++)
        withinStageOHIndices_o[j] = oHist_others[j] -
            CastLIndexToIndex(_m_pumadp->GetFirstObservationHistoryIndex( _m_others[j], _m_stage)); 

    vector<Index> v;
    v.push_back(sI);
    v.push_back(
        IndexTools::IndividualToJointIndicesStepSize(withinStageOHIndices_o, 
            _m_stepsizeJOHOH ) );
    return( IndexTools::IndividualToJointIndicesStepSize( v, 
            _m_stepsizeSJOH) );
}